

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaValidateLengthFacetInternal
              (xmlSchemaFacetPtr facet,xmlSchemaValType valType,xmlChar *value,xmlSchemaValPtr val,
              unsigned_long *length,xmlSchemaWhitespaceValueType ws)

{
  int iVar1;
  unsigned_long uVar2;
  uint local_40;
  uint len;
  xmlSchemaWhitespaceValueType ws_local;
  unsigned_long *length_local;
  xmlSchemaValPtr val_local;
  xmlChar *value_local;
  xmlSchemaValType valType_local;
  xmlSchemaFacetPtr facet_local;
  
  local_40 = 0;
  if ((length == (unsigned_long *)0x0) || (facet == (xmlSchemaFacetPtr)0x0)) {
    return -1;
  }
  *length = 0;
  if (((facet->type != XML_SCHEMA_FACET_LENGTH) && (facet->type != XML_SCHEMA_FACET_MAXLENGTH)) &&
     (facet->type != XML_SCHEMA_FACET_MINLENGTH)) {
    return -1;
  }
  if (((facet->val == (xmlSchemaValPtr)0x0) ||
      ((facet->val->type != XML_SCHEMAS_DECIMAL && (facet->val->type != XML_SCHEMAS_NNINTEGER)))) ||
     (iVar1 = xmlSchemaValDecimalIsInteger(&(facet->val->value).decimal), iVar1 == 0)) {
    return -1;
  }
  if ((val == (xmlSchemaValPtr)0x0) || (val->type != XML_SCHEMAS_HEXBINARY)) {
    if ((val == (xmlSchemaValPtr)0x0) || (val->type != XML_SCHEMAS_BASE64BINARY)) {
      if (valType - XML_SCHEMAS_STRING < 2) {
        if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
          if (valType == XML_SCHEMAS_STRING) {
            local_40 = xmlUTF8Strlen(value);
          }
          else {
            local_40 = xmlSchemaNormLen(value);
          }
        }
        else if (value != (xmlChar *)0x0) {
          if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
            local_40 = xmlSchemaNormLen(value);
          }
          else {
            local_40 = xmlUTF8Strlen(value);
          }
        }
      }
      else {
        if ((2 < valType - XML_SCHEMAS_TOKEN) && (valType != XML_SCHEMAS_NAME)) {
          if (valType == XML_SCHEMAS_QNAME) {
            return 0;
          }
          if (2 < valType - XML_SCHEMAS_NCNAME) {
            if (valType == XML_SCHEMAS_NOTATION) {
              return 0;
            }
            if (valType != XML_SCHEMAS_ANYURI) goto LAB_002079d9;
          }
        }
        if (value != (xmlChar *)0x0) {
          local_40 = xmlSchemaNormLen(value);
        }
      }
    }
    else {
      local_40 = (val->value).decimal.integralPlaces;
    }
  }
  else {
    local_40 = (val->value).decimal.integralPlaces;
  }
LAB_002079d9:
  *length = (ulong)local_40;
  if (facet->type == XML_SCHEMA_FACET_LENGTH) {
    uVar2 = xmlSchemaGetFacetValueAsULong(facet);
    if (local_40 != uVar2) {
      return 0x726;
    }
  }
  else if (facet->type == XML_SCHEMA_FACET_MINLENGTH) {
    uVar2 = xmlSchemaGetFacetValueAsULong(facet);
    if (local_40 < uVar2) {
      return 0x727;
    }
  }
  else {
    uVar2 = xmlSchemaGetFacetValueAsULong(facet);
    if (uVar2 < local_40) {
      return 0x728;
    }
  }
  return 0;
}

Assistant:

static int
xmlSchemaValidateLengthFacetInternal(xmlSchemaFacetPtr facet,
				     xmlSchemaValType valType,
				     const xmlChar *value,
				     xmlSchemaValPtr val,
				     unsigned long *length,
				     xmlSchemaWhitespaceValueType ws)
{
    unsigned int len = 0;

    if ((length == NULL) || (facet == NULL))
        return (-1);
    *length = 0;
    if ((facet->type != XML_SCHEMA_FACET_LENGTH) &&
	(facet->type != XML_SCHEMA_FACET_MAXLENGTH) &&
	(facet->type != XML_SCHEMA_FACET_MINLENGTH))
	return (-1);

    /*
    * TODO: length, maxLength and minLength must be of type
    * nonNegativeInteger only. Check if decimal is used somehow.
    */
    if ((facet->val == NULL) ||
	((facet->val->type != XML_SCHEMAS_DECIMAL) &&
	 (facet->val->type != XML_SCHEMAS_NNINTEGER)) ||
	!(xmlSchemaValDecimalIsInteger(&facet->val->value.decimal)))
 {
	return(-1);
    }
    if ((val != NULL) && (val->type == XML_SCHEMAS_HEXBINARY))
	len = val->value.hex.total;
    else if ((val != NULL) && (val->type == XML_SCHEMAS_BASE64BINARY))
	len = val->value.base64.total;
    else {
	switch (valType) {
	    case XML_SCHEMAS_STRING:
	    case XML_SCHEMAS_NORMSTRING:
		if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
		    /*
		    * This is to ensure API compatibility with the old
		    * xmlSchemaValidateLengthFacet(). Anyway, this was and
		    * is not the correct handling.
		    * TODO: Get rid of this case somehow.
		    */
		    if (valType == XML_SCHEMAS_STRING)
			len = xmlUTF8Strlen(value);
		    else
			len = xmlSchemaNormLen(value);
		} else if (value != NULL) {
		    if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE)
			len = xmlSchemaNormLen(value);
		    else
		    /*
		    * Should be OK for "preserve" as well.
		    */
		    len = xmlUTF8Strlen(value);
		}
		break;
	    case XML_SCHEMAS_IDREF:
	    case XML_SCHEMAS_TOKEN:
	    case XML_SCHEMAS_LANGUAGE:
	    case XML_SCHEMAS_NMTOKEN:
	    case XML_SCHEMAS_NAME:
	    case XML_SCHEMAS_NCNAME:
	    case XML_SCHEMAS_ID:
		/*
		* FIXME: What exactly to do with anyURI?
		*/
	    case XML_SCHEMAS_ANYURI:
		if (value != NULL)
		    len = xmlSchemaNormLen(value);
		break;
	    case XML_SCHEMAS_QNAME:
	    case XML_SCHEMAS_NOTATION:
		/*
		* For QName and NOTATION, those facets are
		* deprecated and should be ignored.
		*/
		return (0);
	    default:
		/* TODO */
                break;
	}
    }
    *length = (unsigned long) len;
    /*
    * TODO: Return the whole expected value. (This may be possible now with xmlSchemaValDecimalCompareWithInteger)
    */
    if (facet->type == XML_SCHEMA_FACET_LENGTH) {
        if (len != xmlSchemaGetFacetValueAsULong(facet))
	    return(XML_SCHEMAV_CVC_LENGTH_VALID);
    } else if (facet->type == XML_SCHEMA_FACET_MINLENGTH) {
        if (len < xmlSchemaGetFacetValueAsULong(facet))
	    return(XML_SCHEMAV_CVC_MINLENGTH_VALID);
    } else {
        if (len > xmlSchemaGetFacetValueAsULong(facet))
	    return(XML_SCHEMAV_CVC_MAXLENGTH_VALID);
    }

    return (0);
}